

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modern-coapp.hpp
# Opt level: O1

bytes_t * __thiscall coapp::pdu::to_bytes(bytes_t *__return_storage_ptr__,pdu *this)

{
  _Rb_tree_color _Var1;
  size_type sVar2;
  pointer __src;
  pointer pcVar3;
  byte bVar4;
  _Base_ptr p_Var5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ptrdiff_t _Num;
  byte bVar13;
  uint uVar14;
  _Rb_tree_color _Var15;
  pointer puVar16;
  bytes_t options_buf;
  allocator_type local_69;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  int local_4c;
  pdu *local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_40;
  _Rb_tree_node_base *local_38;
  
  sVar2 = (this->_payload)._M_string_length;
  iVar6 = 0;
  if (sVar2 != 0) {
    iVar6 = (int)sVar2 + 1;
  }
  iVar6 = (*(int *)&(this->_token).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
          *(int *)&(this->_token).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start) + iVar6 + 4;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((this->_options)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    local_4c = iVar6;
    local_40 = __return_storage_ptr__;
    Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
              (&local_68,0x400);
    p_Var5 = (this->_options)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_38 = &(this->_options)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_48 = this;
    if (p_Var5 != local_38) {
      _Var15 = _S_red;
      do {
        _Var1 = p_Var5[1]._M_color;
        uVar10 = _Var1 - _Var15;
        uVar11 = (uint)(byte)(0xe - (uVar10 < 0x10d));
        if (uVar10 < 0xd) {
          uVar11 = uVar10;
        }
        uVar7 = *(int *)&p_Var5[1]._M_left - *(int *)&p_Var5[1]._M_parent;
        uVar14 = (uint)(byte)(0xe - (uVar7 < 0x10d));
        if (uVar7 < 0xd) {
          uVar14 = uVar7;
        }
        bVar4 = (byte)uVar11;
        bVar13 = (byte)uVar14;
        local_69 = (allocator_type)(bVar4 << 4 | bVar13);
        Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
        emplace_back<unsigned_char>(&local_68,(uchar *)&local_69);
        if (0xc < bVar4) {
          if (bVar4 == 0xe) {
            uVar10 = uVar10 - 0x10d;
            if (0xffff < uVar10) goto LAB_00148506;
            local_69 = SUB41(uVar10 >> 8,0);
            Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
            emplace_back<unsigned_char>(&local_68,(uchar *)&local_69);
            local_69 = SUB41(uVar10,0);
            Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
            emplace_back<unsigned_char>(&local_68,(uchar *)&local_69);
          }
          else if ((uVar11 & 0xff) == 0xd) {
            local_69 = (allocator_type)((char)uVar10 - 0xd);
            Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
            emplace_back<unsigned_char>(&local_68,(uchar *)&local_69);
          }
        }
        if (0xc < bVar13) {
          lVar12 = (long)p_Var5[1]._M_left - (long)p_Var5[1]._M_parent;
          if (bVar13 == 0xe) {
            uVar11 = (int)lVar12 - 0x10d;
            if (0xffff < uVar11) {
LAB_00148506:
              __assert_fail("encoded_val <= std::numeric_limits<uint16_t>::max()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/LanderN[P]modern-coapp/include/modern-coapp.hpp"
                            ,0xe3,
                            "auto coapp::pdu::to_bytes()::(anonymous class)::operator()(const byte_t, const uint32_t &) const"
                           );
            }
            local_69 = SUB41(uVar11 >> 8,0);
            Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
            emplace_back<unsigned_char>(&local_68,(uchar *)&local_69);
            local_69 = SUB41(uVar11,0);
            Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
            emplace_back<unsigned_char>(&local_68,(uchar *)&local_69);
          }
          else if ((uVar14 & 0xff) == 0xd) {
            local_69 = (allocator_type)((char)lVar12 - 0xd);
            Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
            emplace_back<unsigned_char>(&local_68,(uchar *)&local_69);
          }
        }
        std::__copy_move<false,false,std::random_access_iterator_tag>::
        __copy_m<unsigned_char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                  ((uchar *)p_Var5[1]._M_parent,(uchar *)p_Var5[1]._M_left,&local_68);
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
        _Var15 = _Var1;
      } while (p_Var5 != local_38);
    }
    iVar6 = local_4c +
            ((int)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_finish -
            (int)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start);
    __return_storage_ptr__ = local_40;
    this = local_48;
  }
  Catch::clara::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,(long)iVar6,&local_69);
  iVar6._0_1_ = this->_version;
  iVar6._1_1_ = this->_type;
  iVar6._2_1_ = this->_code;
  iVar6._3_1_ = this->field_0x3;
  *(__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
   _M_impl.super__Vector_impl_data._M_start =
       (char)*(undefined4 *)
              &(this->_token).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish -
       (char)*(undefined4 *)
              &(this->_token).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start | this->_type << 4 | (byte)(iVar6 << 6);
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start[1] = this->_code;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start[2] = *(uchar *)((long)&this->_message_id + 1);
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start[3] = (uchar)this->_message_id;
  puVar16 = (__return_storage_ptr__->
            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start + 4;
  __src = (this->_token).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
  sVar8 = (long)(this->_token).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)__src;
  if (sVar8 != 0) {
    memmove(puVar16,__src,sVar8);
  }
  puVar16 = puVar16 + ((long)(this->_token).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->_token).
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
  sVar8 = (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (sVar8 != 0) {
    memmove(puVar16,local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,sVar8);
    puVar16 = puVar16 + sVar8;
  }
  if ((this->_payload)._M_string_length != 0) {
    *puVar16 = 0xff;
    sVar2 = (this->_payload)._M_string_length;
    if (0 < (long)sVar2) {
      pcVar3 = (this->_payload)._M_dataplus._M_p;
      lVar12 = sVar2 + 1;
      lVar9 = 0;
      do {
        puVar16[lVar9 + 1] = pcVar3[lVar9];
        lVar12 = lVar12 + -1;
        lVar9 = lVar9 + 1;
      } while (1 < lVar12);
    }
  }
  if (local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

bytes_t to_bytes() const
    {
        auto required_size = 4; // header length
        required_size += _token.size();

        if (auto pl_size = _payload.size())
            required_size += 1 /* separator */ + pl_size;

        // Encode Options
        bytes_t options_buf;
        if (_options.size()) {
            // Try to minimize allocations, options will typically fit in 1024 bytes
            // (does not increase vector size)
            options_buf.reserve(1024);

            auto prev_delta = 0;
            for (const auto& [number, value]: _options) {
                auto option_delta = number - prev_delta;
                prev_delta = number;

                auto get_nibble = [&] (const uint32_t& val) -> uint8_t {
                    if (val < 13)
                        return val;
                    if (val < 269)
                        return 13;
                    return 14;
                };

                byte_t delta_nibble = get_nibble(option_delta);
                byte_t length_nibble = get_nibble(value.size());
                options_buf.push_back((delta_nibble << 4) | length_nibble);

                auto encode_val = [&] (const byte_t nibble, const uint32_t& val) {
                    if (nibble < 13)
                        return; // already encoded in nibble

                    if (nibble == 13) {
                        options_buf.push_back(val - 13);
                    } else if (nibble == 14) {
                        auto encoded_val = val - 269;
                        assert(encoded_val <= std::numeric_limits<uint16_t>::max());
                        options_buf.push_back(encoded_val >> 8);
                        options_buf.push_back(encoded_val);
                    }
                };
                encode_val(delta_nibble, option_delta);
                encode_val(length_nibble, value.size());

                std::copy(value.begin(), value.end(),
                          std::back_inserter(options_buf));
            }

            required_size += options_buf.size();
        }

        bytes_t bytes(required_size);

        // Header
        bytes[0] = (_version << 6) | (_type << 4) | _token.size();
        bytes[1] = _code;
        bytes[2] = _message_id >> 8;
        bytes[3] = _message_id;

        // Token
        auto it = bytes.begin() + 4;
        std::copy(_token.begin(), _token.end(), it);
        it += _token.size();

        // Options
        if (auto s = options_buf.size()) {
            std::move(options_buf.begin(), options_buf.end(), it);
            it += s;
        }

        // Payload
        if (_payload.size()) {
            *it = 0xff;
            std::copy(_payload.begin(), _payload.end(), ++it);
        }

        return bytes;
    }